

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_icdf<trng::cauchy_dist<long_double>>(cauchy_dist<long_double> *d)

{
  longdouble lVar1;
  long lVar2;
  undefined1 x [16];
  pointer plVar3;
  ulong uVar4;
  int i;
  int iVar5;
  AssertionHandler *this;
  AssertionHandler *pAVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar9;
  longdouble in_ST4;
  longdouble lVar10;
  vector<long_double,_std::allocator<long_double>_> p_values;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffea2;
  vector<long_double,_std::allocator<long_double>_> local_138;
  int local_114;
  SourceLineInfo local_110;
  longdouble local_fc;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  undefined1 local_c8 [16];
  longdouble *local_b8;
  char *local_b0;
  char *pcStack_a8;
  longdouble *local_a0;
  StringRef local_98;
  longdouble local_88;
  AssertionHandler local_78;
  
  local_e4 = (longdouble)2.7755576e-17;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  local_78.m_assertionInfo.macroName._0_10_ = (BADTYPE)0.5;
  local_d8 = local_e4;
  std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
            (&local_138,(iterator)0x0,(longdouble *)&local_78);
  iVar5 = 2;
  do {
    lVar7 = in_ST3;
    in_ST3 = in_ST4;
    lVar9 = in_ST4;
    local_114 = iVar5;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)0 + in_ST0;
    if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_138,
                 (iterator)
                 local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar9;
    }
    else {
      *local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar9;
    }
    lVar9 = in_ST4;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)1 - in_ST1;
    if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_138,
                 (iterator)
                 local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
    }
    else {
      *local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    this = (AssertionHandler *)
           local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish;
    plVar3 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = iVar5 + 1;
    in_ST1 = lVar7;
  } while (iVar5 != 0x40);
  if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar3);
    plVar3 = local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_f0 = _DAT_002a7940;
      pAVar6 = (AssertionHandler *)
               local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(longdouble *)&(pAVar6->m_assertionInfo).macroName;
        x._10_6_ = in_stack_fffffffffffffea2;
        x._0_10_ = lVar1;
        lVar10 = lVar9;
        trng::cauchy_dist<long_double>::icdf
                  ((result_type_conflict3 *)d,(cauchy_dist<long_double> *)this,
                   (result_type_conflict3)x);
        atanl();
        lVar8 = ABS((local_f0 * lVar7 + (longdouble)0.5) - lVar1);
        lVar7 = in_ST3;
        lVar1 = lVar9;
        if (local_e4 <= lVar8) {
          local_c8._0_8_ = "REQUIRE";
          local_c8._8_8_ = 7;
          local_110.file =
               "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
          ;
          local_110.line = 0xa8;
          Catch::StringRef::StringRef(&local_98,"std::abs(y - p) < eps");
          Catch::AssertionHandler::AssertionHandler
                    (&local_78,(StringRef *)local_c8,&local_110,local_98,Normal);
          local_fc = local_d8;
          local_88 = lVar8;
          Catch::StringRef::StringRef((StringRef *)&local_110,"<");
          local_c8[9] = lVar8 < local_fc;
          local_c8[8] = 1;
          local_c8._0_8_ = &PTR_streamReconstructedExpression_00318338;
          local_b8 = &local_88;
          local_b0 = local_110.file;
          pcStack_a8 = (char *)local_110.line;
          local_a0 = &local_d8;
          this = (AssertionHandler *)local_c8;
          Catch::AssertionHandler::handleExpr(&local_78,(ITransientExpression *)local_c8);
          Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c8);
          Catch::AssertionHandler::complete(&local_78);
          lVar7 = in_ST3;
          lVar1 = lVar9;
          if (local_78.m_completed == false) {
            this = &local_78;
            (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])();
            lVar7 = in_ST3;
            lVar1 = lVar9;
          }
        }
        lVar9 = lVar10;
        in_ST3 = lVar1;
        pAVar6 = (AssertionHandler *)&(pAVar6->m_assertionInfo).lineInfo;
      } while (pAVar6 != (AssertionHandler *)plVar3);
    }
  }
  if ((AssertionHandler *)
      local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (AssertionHandler *)0x0) {
    operator_delete(local_138.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}